

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
* __thiscall
pstore::json::details::
token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>::consume
          (pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
           *__return_storage_ptr__,
          token_matcher<callbacks_proxy<mock_json_callbacks>,_pstore::json::details::false_complete>
          *this,parser<callbacks_proxy<mock_json_callbacks>_> *parser,maybe<char,_void> *ch)

{
  mock_json_callbacks *pmVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  error_category *peVar7;
  error_category *extraout_RDX;
  bool bVar8;
  error_code err;
  error_code err_00;
  bool bVar9;
  
  iVar3 = (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_;
  if (iVar3 == 2) {
    if (ch->valid_ == true) {
      pcVar6 = maybe<char,_void>::operator->(ch);
      pcVar5 = this->text_;
      if (*pcVar6 == *pcVar5) {
        this->text_ = pcVar5 + 1;
        bVar8 = true;
        if (pcVar5[1] != '\0') goto LAB_00132b11;
        iVar3 = 3;
        bVar9 = true;
        goto LAB_00132b0d;
      }
    }
LAB_00132aec:
    peVar7 = get_error_category();
    err_00._M_cat = peVar7;
    err_00._0_8_ = 0xb;
    bVar2 = parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err_00);
    bVar8 = true;
    iVar3 = 1;
    bVar9 = true;
    if (!bVar2) goto LAB_00132b11;
  }
  else {
    bVar9 = true;
    bVar8 = true;
    if (iVar3 != 3) {
      if (iVar3 == 1) {
        assert_failed("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                      ,0x1ad);
      }
      goto LAB_00132b11;
    }
    if (ch->valid_ == true) {
      pcVar5 = maybe<char,_void>::operator->(ch);
      iVar3 = isalnum((int)*pcVar5);
      if (iVar3 != 0) goto LAB_00132aec;
      bVar9 = false;
    }
    pmVar1 = (parser->callbacks_).original_;
    uVar4 = (*(pmVar1->super_json_callbacks_base)._vptr_json_callbacks_base[6])(pmVar1,0);
    err._4_4_ = 0;
    err._M_value = uVar4;
    err._M_cat = extraout_RDX;
    parser<callbacks_proxy<mock_json_callbacks>_>::set_error(parser,err);
    iVar3 = 1;
  }
LAB_00132b0d:
  bVar8 = bVar9;
  (this->super_matcher<callbacks_proxy<mock_json_callbacks>_>).state_ = iVar3;
LAB_00132b11:
  *(undefined8 *)
   &(__return_storage_ptr__->first)._M_t.
    super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
       = 1;
  (__return_storage_ptr__->first)._M_t.
  super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  .
  super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
  ._M_head_impl = (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0;
  __return_storage_ptr__->second = bVar8;
  return __return_storage_ptr__;
}

Assistant:

std::pair<typename matcher<Callbacks>::pointer, bool>
            token_matcher<Callbacks, DoneFunction>::consume (parser<Callbacks> & parser,
                                                             maybe<char> ch) {
                bool match = true;
                switch (this->get_state ()) {
                case start_state:
                    if (!ch || *ch != *text_) {
                        this->set_error (parser, error_code::unrecognized_token);
                    } else {
                        ++text_;
                        if (*text_ == '\0') {
                            // We've run out of input text, so ensure that the next character isn't
                            // alpha-numeric.
                            this->set_state (last_state);
                        }
                    }
                    break;
                case last_state:
                    if (ch) {
                        if (std::isalnum (*ch) != 0) {
                            this->set_error (parser, error_code::unrecognized_token);
                            return {nullptr, true};
                        }
                        match = false;
                    }
                    this->set_error (parser, done_ (parser));
                    this->set_state (done_state);
                    break;
                case done_state: PSTORE_ASSERT (false); break;
                }
                return {nullptr, match};
            }